

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * __thiscall
pfederc::Lexer::getLineFromIndex_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,size_t index)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  size_t sVar4;
  size_type *psVar5;
  char cVar6;
  long *local_60;
  uint local_58;
  long local_50 [2];
  string local_40;
  
  if (this->currentEndIndex < index) {
    cVar6 = '\x01';
    if (9 < index) {
      sVar4 = index;
      cVar2 = '\x04';
      do {
        cVar6 = cVar2;
        if (sVar4 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_00105687;
        }
        if (sVar4 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_00105687;
        }
        if (sVar4 < 10000) goto LAB_00105687;
        bVar1 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        cVar2 = cVar6 + '\x04';
      } while (bVar1);
      cVar6 = cVar6 + '\x01';
    }
LAB_00105687:
    local_60 = local_50;
    std::__cxx11::string::_M_construct((ulong)&local_60,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,index);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x10b0cf);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_40.field_2._M_allocated_capacity = *psVar5;
      local_40.field_2._8_8_ = plVar3[3];
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    }
    else {
      local_40.field_2._M_allocated_capacity = *psVar5;
      local_40._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_40._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    fatal("lexer.cpp",0x1c,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    getLineNumber(this,index);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->fileContent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getLineFromIndex(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return "";
  }

  size_t lineIndex = getLineNumber(index);

  size_t lineStartIndex = lineIndices[lineIndex];
  size_t lineEndIndex = lineIndex == lineIndices.size() - 1
    ? currentEndIndex : lineIndices[lineIndex + 1] - 1;
  if (lineEndIndex > lineStartIndex
        && (fileContent[lineEndIndex] == '\r'
          || fileContent[lineEndIndex] == '\n')) {
    --lineEndIndex;
  }

  std::string result(fileContent.substr(lineStartIndex,
    lineEndIndex - lineStartIndex));
  return result;
}